

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::showMap(Map *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  string local_38;
  int local_14;
  Map *pMStack_10;
  int i;
  Map *this_local;
  
  local_14 = 0;
  pMStack_10 = this;
  while( true ) {
    iVar1 = local_14;
    iVar2 = Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::getVertexCount(this->gameMap);
    if (iVar2 <= iVar1) break;
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,local_14);
    poVar3 = std::operator<<(poVar3,". ");
    this_00 = Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::getVertex(this->gameMap,local_14);
    GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    toString(&local_38,this_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_38);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_38);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Map::showMap() {
    for (int i = 0; i < gameMap->getVertexCount(); i++)
    {
        cout << (i) << ". " << gameMap->getVertex(i)->toString() << endl;
        // Player can be in all vertices except Manhattan (0) , since it can be in its subvertices
    }
}